

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrlib.c
# Opt level: O2

bstring bjoin(bstrList *bl,bstring sep)

{
  int iVar1;
  bstring __ptr;
  uchar *puVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  
  if (bl == (bstrList *)0x0) {
    return (bstring)0x0;
  }
  lVar4 = (long)bl->qty;
  if ((-1 < lVar4) && ((sep == (bstring)0x0 || ((-1 < sep->slen && (sep->data != (uchar *)0x0))))))
  {
    iVar5 = 1;
    for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
      iVar1 = bl->entry[lVar3]->slen;
      if (iVar1 < 0) {
        return (bstring)0x0;
      }
      iVar5 = iVar5 + iVar1;
    }
    if (sep != (bstring)0x0) {
      iVar5 = iVar5 + (bl->qty + -1) * sep->slen;
    }
    __ptr = (bstring)malloc(0x10);
    if (__ptr != (bstring)0x0) {
      puVar2 = (uchar *)malloc((long)iVar5);
      __ptr->data = puVar2;
      if (puVar2 != (uchar *)0x0) {
        __ptr->mlen = iVar5;
        __ptr->slen = iVar5 + -1;
        iVar5 = 0;
        for (lVar3 = 0; lVar4 != lVar3; lVar3 = lVar3 + 1) {
          if (lVar3 != 0 && sep != (bstring)0x0) {
            iVar1 = sep->slen;
            memcpy(puVar2 + iVar5,sep->data,(long)iVar1);
            iVar5 = iVar5 + iVar1;
          }
          iVar1 = bl->entry[lVar3]->slen;
          memcpy(puVar2 + iVar5,bl->entry[lVar3]->data,(long)iVar1);
          iVar5 = iVar5 + iVar1;
        }
        puVar2[iVar5] = '\0';
        return __ptr;
      }
      free(__ptr);
    }
  }
  return (bstring)0x0;
}

Assistant:

bstring bjoin (const struct bstrList * bl, const bstring sep) {
bstring b;
int i, c, v;

	if (bl == NULL || bl->qty < 0) return NULL;
	if (sep != NULL && (sep->slen < 0 || sep->data == NULL)) return NULL;

	for (i = 0, c = 1; i < bl->qty; i++) {
		v = bl->entry[i]->slen;
		if (v < 0) return NULL;	/* Invalid input */
		c += v;
		if (c < 0) return NULL;	/* Wrap around ?? */
	}

	if (sep != NULL) c += (bl->qty - 1) * sep->slen;

	b = (bstring) bstr__alloc (sizeof (struct tagbstring));
	if (b == NULL) return NULL; /* Out of memory */
	b->data = (unsigned char *) bstr__alloc (c);
	if (b->data == NULL) {
		bstr__free (b);
		return NULL;
	}

	b->mlen = c;
	b->slen = c-1;

	for (i = 0, c = 0; i < bl->qty; i++) {
		if (i > 0 && sep != NULL) {
			bstr__memcpy (b->data + c, sep->data, sep->slen);
			c += sep->slen;
		}
		v = bl->entry[i]->slen;
		bstr__memcpy (b->data + c, bl->entry[i]->data, v);
		c += v;
	}
	b->data[c] = (unsigned char) '\0';
	return b;
}